

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void deqp::gls::anon_unknown_1::runTests
               (TestContext *testCtx,RenderContext *renderContext,Random *rng,deUint32 format,
               size_t bufferSize,size_t offset,size_t size,RenderBits preRender,
               ShaderProgram *preRenderProgram,ModifyBits modifyType,RenderBits postRender,
               ShaderProgram *postRenderProgram)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TextureFormat TVar2;
  uchar *puVar3;
  undefined1 auVar4 [8];
  TextureFormat TVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ContextType CVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ContextInfo *this;
  undefined4 extraout_var_01;
  size_t sVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar14;
  undefined4 extraout_var_04;
  TestError *pTVar15;
  ulong uVar16;
  long lVar17;
  undefined8 uVar18;
  size_t sVar19;
  int height;
  ulong uVar20;
  uchar uVar21;
  void *pvVar22;
  long lVar23;
  RenderContext *context;
  char *pcVar24;
  TextureFormat TVar25;
  size_t sVar26;
  size_t offset_00;
  float fVar27;
  size_type __dnew;
  ScopedLogSection section;
  ScopedLogSection section_2;
  Surface referenceTarget;
  ScopedLogSection modifySection;
  Vec4 clearColor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferData;
  ResultCollector resultCollector;
  string local_368;
  TextureFormat local_340;
  deRandom *local_338;
  size_t local_330;
  RenderContext *local_328;
  undefined1 local_320 [8];
  undefined8 local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  void *local_300;
  uchar *local_2f8;
  deUint32 local_2ec;
  string local_2e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  Surface local_2b0;
  int local_298;
  deUint32 local_294;
  int local_290;
  int local_28c;
  undefined1 local_288 [8];
  TextureFormat TStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [6];
  ios_base local_210 [272];
  ScopedLogSection local_100;
  Vec4 local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  TestContext *local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  ResultCollector local_a8;
  deRandom local_58;
  deRandom local_48;
  
  local_338 = &rng->m_rnd;
  local_330 = bufferSize;
  local_294 = format;
  iVar8 = (*renderContext->_vptr_RenderContext[4])(renderContext);
  iVar10 = *(int *)CONCAT44(extraout_var,iVar8);
  iVar8 = ((int *)CONCAT44(extraout_var,iVar8))[1];
  iVar9 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  local_298 = 0x100;
  if (iVar10 < 0x100) {
    local_298 = iVar10;
  }
  height = 0x100;
  if (iVar8 < 0x100) {
    height = iVar8;
  }
  local_f8.m_data[0] = 0.25;
  local_f8.m_data[1] = 0.5;
  local_f8.m_data[2] = 0.75;
  local_f8.m_data[3] = 1.0;
  TVar25 = (TextureFormat)testCtx->m_log;
  local_288 = (undefined1  [8])local_278;
  local_290 = iVar10;
  local_28c = iVar8;
  local_c8 = testCtx;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,0x98644f);
  tcu::ResultCollector::ResultCollector(&local_a8,(TestLog *)TVar25,(string *)local_288);
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity + 1);
  }
  local_288 = (undefined1  [8])local_278;
  local_320._0_4_ = CHANNELORDER_LAST;
  local_320._4_4_ = SNORM_INT8;
  local_340 = TVar25;
  local_c0 = CONCAT44(extraout_var_00,iVar9);
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)local_320);
  local_278[0]._M_allocated_capacity = local_320;
  *(undefined8 *)local_288 = 0x6e656d656c706d49;
  builtin_strncpy((char *)((long)local_288 + 8),"tation V",8);
  builtin_strncpy((char *)((long)local_288 + 0xd),"n Values",8);
  TStack_280.order = local_320._0_4_;
  TStack_280.type = local_320._4_4_;
  *(char *)((long)local_288 + (long)local_320) = '\0';
  local_368._M_dataplus._M_p = (pointer)0x15;
  local_320 = (undefined1  [8])&local_310;
  local_320 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_320,(ulong)&local_368)
  ;
  local_310._M_allocated_capacity = (size_type)local_368._M_dataplus._M_p;
  *(undefined8 *)local_320 = 0x6e656d656c706d49;
  builtin_strncpy((char *)((long)local_320 + 8),"tation V",8);
  builtin_strncpy((char *)((long)local_320 + 0xd),"n Values",8);
  local_318 = (TestLog *)local_368._M_dataplus._M_p;
  local_368._M_dataplus._M_p[(long)local_320] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2e8,(TestLog *)local_340,(string *)local_288,
             (string *)local_320);
  if (local_320 != (undefined1  [8])&local_310) {
    operator_delete((void *)local_320,(ulong)(local_310._M_allocated_capacity + 1));
  }
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity + 1);
  }
  this = glu::ContextInfo::create(renderContext);
  local_328 = renderContext;
  iVar10 = (*renderContext->_vptr_RenderContext[3])(renderContext);
  lVar23 = CONCAT44(extraout_var_01,iVar10);
  CVar11.super_ApiType.m_bits = (ApiType)(*local_328->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(CVar11,(ApiType)0x133);
  if (bVar6) {
    local_320 = (undefined1  [8])((ulong)local_320 & 0xffffffff00000000);
    (**(code **)(lVar23 + 0x868))(0x8c2b);
    dVar12 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar12,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x325);
    local_288._0_4_ = local_340.order;
    local_288._4_4_ = local_340.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_280,"GL_MAX_TEXTURE_BUFFER_SIZE : ",0x1d);
    std::ostream::operator<<(&TStack_280,local_320._0_4_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0081d2e2:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
    std::ios_base::~ios_base(local_210);
  }
  else {
    CVar11.super_ApiType.m_bits = (ApiType)(*local_328->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(CVar11,(ApiType)0x13);
    if ((bVar6) &&
       (bVar6 = glu::ContextInfo::isExtensionSupported(this,"GL_EXT_texture_buffer"), bVar6)) {
      local_320 = (undefined1  [8])((ulong)local_320 & 0xffffffff00000000);
      (**(code **)(lVar23 + 0x868))(0x8c2b);
      dVar12 = (**(code **)(lVar23 + 0x800))();
      glu::checkError(dVar12,"glGetIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x32f);
      local_288._0_4_ = local_340.order;
      local_288._4_4_ = local_340.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"GL_MAX_TEXTURE_BUFFER_SIZE_EXT : ",0x21);
      std::ostream::operator<<(&TStack_280,local_320._0_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
      std::ios_base::~ios_base(local_210);
      local_320 = (undefined1  [8])((ulong)local_320 & 0xffffffff00000000);
      (**(code **)(lVar23 + 0x868))(0x919f);
      dVar12 = (**(code **)(lVar23 + 0x800))();
      glu::checkError(dVar12,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x338);
      local_288._0_4_ = local_340.order;
      local_288._4_4_ = local_340.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT : ",0x29);
      std::ostream::operator<<(&TStack_280,local_320._0_4_);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_0081d2e2;
    }
  }
  if (this != (ContextInfo *)0x0) {
    (*this->_vptr_ContextInfo[1])(this);
  }
  tcu::TestLog::endSection((TestLog *)local_2e8._M_dataplus._M_p);
  local_288 = (undefined1  [8])local_278;
  local_278[0]._M_allocated_capacity = (uchar *)0x2065727574786554;
  local_278[0]._8_4_ = 0x6f666e49;
  TStack_280.order = sR;
  TStack_280.type = SNORM_INT8;
  local_278[0]._M_local_buf[0xc] = '\0';
  local_310._M_allocated_capacity = 0x2065727574786554;
  local_318 = (TestLog *)0xc;
  local_310._8_5_ = 0x6f666e49;
  local_320 = (undefined1  [8])&local_310;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_368,(TestLog *)local_340,(string *)local_288,
             (string *)local_320);
  context = local_328;
  if (local_320 != (undefined1  [8])&local_310) {
    operator_delete((void *)local_320,(ulong)(local_310._M_allocated_capacity + 1));
  }
  TVar25 = local_340;
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,(ulong)(local_278[0]._M_allocated_capacity + 1));
  }
  TVar2 = local_340;
  local_340.order = TVar25.order;
  local_340.type = TVar25.type;
  local_288._0_4_ = local_340.order;
  local_288._4_4_ = local_340.type;
  local_340 = TVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&TStack_280,"Texture format : ",0x11);
  local_320 = (undefined1  [8])glu::getTextureFormatName;
  local_318 = (TestLog *)CONCAT44(local_318._4_4_,local_294);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_320,(ostream *)&TStack_280);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
  std::ios_base::~ios_base(local_210);
  TVar25 = local_340;
  local_288._0_4_ = local_340.order;
  local_288._4_4_ = local_340.type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,"Buffer size : ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
  std::ios_base::~ios_base(local_210);
  TVar2 = local_340;
  if (size != 0 || offset != 0) {
    local_340.order = TVar25.order;
    local_340.type = TVar25.type;
    local_288._0_4_ = local_340.order;
    local_288._4_4_ = local_340.type;
    local_340 = TVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_280,"Buffer range offset: ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
    std::ios_base::~ios_base(local_210);
    TVar25 = local_340;
    local_288._0_4_ = local_340.order;
    local_288._4_4_ = local_340.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&TStack_280,"Buffer range size: ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
    std::ios_base::~ios_base(local_210);
  }
  tcu::TestLog::endSection((TestLog *)local_368._M_dataplus._M_p);
  tcu::Surface::Surface(&local_2b0,local_298,height);
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.x = local_338->x;
  local_58.y = local_338->y;
  local_58.z = local_338->z;
  local_58.w = local_338->w;
  genRandomCoords((Random *)&local_58,&local_e8,0,local_330);
  uVar16 = 0;
  uVar20 = 0;
  do {
    if (uVar16 < size + offset && offset <= uVar16) {
      uVar21 = 'U';
      if (uVar20 < 2) {
        uVar21 = 0xaa;
      }
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 * 2] = uVar21;
      uVar21 = 'U';
      if ((uVar20 & 1) == 0) {
        uVar21 = 0xaa;
      }
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 * 2 + 1] = uVar21;
    }
    uVar20 = uVar20 + 1;
    uVar16 = uVar16 + 0x55;
  } while (uVar20 != 4);
  glu::TextureBuffer::TextureBuffer
            ((TextureBuffer *)local_320,context,local_294,local_330,offset,size,
             local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar23 = local_c0;
  if (local_28c < 0x40 && local_290 < 0x40) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Too small viewport",
               "width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
               ,0x381);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_c0 + 0x1a00))(0,0,local_298,height);
  (**(code **)(lVar23 + 0x1c0))
            (local_f8.m_data[0],local_f8.m_data[1],local_f8.m_data[2],local_f8.m_data[3]);
  (**(code **)(lVar23 + 0x188))(0x4000);
  dVar12 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar12,"Screen setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x389);
  local_368._M_dataplus._M_p = (pointer)0x300000008;
  pvVar22 = (void *)local_2b0.m_pixels.m_cap;
  if ((void *)local_2b0.m_pixels.m_cap != (void *)0x0) {
    pvVar22 = local_2b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_368,local_2b0.m_width,
             local_2b0.m_height,1,pvVar22);
  tcu::clear((PixelBufferAccess *)local_288,&local_f8);
  glu::TextureBuffer::upload((TextureBuffer *)local_320);
  if (preRender != RENDERBITS_NONE) {
    local_368._M_dataplus._M_p = (pointer)0x300000008;
    pvVar22 = (void *)local_2b0.m_pixels.m_cap;
    if ((void *)local_2b0.m_pixels.m_cap != (void *)0x0) {
      pvVar22 = local_2b0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_368,local_2b0.m_width,
               local_2b0.m_height,1,pvVar22);
    render((TestLog *)TVar25,context,preRender,(Random *)local_338,preRenderProgram,
           (TextureBuffer *)local_320,(PixelBufferAccess *)local_288);
  }
  if (modifyType != MODIFYBITS_NONE) {
    local_288 = (undefined1  [8])local_278;
    local_368._M_dataplus._M_p = (pointer)0x18;
    local_288 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_368);
    paVar1 = &local_368.field_2;
    local_278[0]._M_allocated_capacity = local_368._M_dataplus._M_p;
    *(undefined8 *)local_288 = 0x6e69796669646f4d;
    builtin_strncpy((char *)((long)local_288 + 8),"g Textur",8);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_288 + 0x10))->_M_allocated_capacity = 0x7265666675622065;
    TStack_280 = (TextureFormat)local_368._M_dataplus._M_p;
    *(char *)((long)local_288 + (long)local_368._M_dataplus._M_p) = '\0';
    local_2e8._M_dataplus._M_p = (pointer)0x18;
    local_368._M_dataplus._M_p = (pointer)paVar1;
    local_368._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_2e8);
    local_368.field_2._M_allocated_capacity = (size_type)local_2e8._M_dataplus._M_p;
    builtin_strncpy(local_368._M_dataplus._M_p,"Modifying Texture Buffer",0x18);
    local_368._M_string_length = (size_type)local_2e8._M_dataplus._M_p;
    local_2e8._M_dataplus._M_p[(long)local_368._M_dataplus._M_p] = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              (&local_100,(TestLog *)TVar25,(string *)local_288,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,local_278[0]._M_allocated_capacity + 1);
    }
    local_288 = (undefined1  [8])local_278;
    local_368._M_dataplus._M_p = (pointer)0x11;
    local_288 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_368);
    local_278[0]._M_allocated_capacity = local_368._M_dataplus._M_p;
    *(undefined8 *)local_288 = 0x4f20796669646f4d;
    builtin_strncpy((char *)((long)local_288 + 8),"peration",8);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)local_288 + 0x10))->_M_local_buf[0] = 's';
    TStack_280 = (TextureFormat)local_368._M_dataplus._M_p;
    *(uchar *)((long)local_288 + (long)local_368._M_dataplus._M_p) = '\0';
    local_2e8._M_dataplus._M_p = (pointer)0x11;
    local_368._M_dataplus._M_p = (pointer)paVar1;
    local_368._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_2e8);
    local_368.field_2._M_allocated_capacity = (size_type)local_2e8._M_dataplus._M_p;
    *(undefined8 *)local_368._M_dataplus._M_p = 0x4f20796669646f4d;
    builtin_memcpy((uchar *)((long)local_368._M_dataplus._M_p + 8),"peration",8);
    *(uchar *)((long)local_368._M_dataplus._M_p + 0x10) = 's';
    local_368._M_string_length = (size_type)local_2e8._M_dataplus._M_p;
    local_2e8._M_dataplus._M_p[(long)local_368._M_dataplus._M_p] = '\0';
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_2c8,(TestLog *)TVar25,(string *)local_288,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,
                      (ulong)(local_368.field_2._M_allocated_capacity + 1));
    }
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,(ulong)(local_278[0]._M_allocated_capacity + 1));
    }
    lVar23 = 0;
    do {
      if ((*(ModifyBits *)((long)&DAT_00b6d3e0 + lVar23) & modifyType) != MODIFYBITS_NONE) {
        local_288 = (undefined1  [8])TVar25;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
        pcVar24 = *(char **)((long)&PTR_anon_var_dwarf_15c37af_00b6d3e8 + lVar23);
        if (pcVar24 == (char *)0x0) {
          std::ios::clear((int)&TStack_280 + (int)*(undefined8 *)((long)TStack_280 + -0x18));
        }
        else {
          sVar13 = strlen(pcVar24);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,pcVar24,sVar13);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
        std::ios_base::~ios_base(local_210);
        TVar25 = local_340;
      }
      lVar23 = lVar23 + 0x10;
    } while (lVar23 != 0x40);
    tcu::TestLog::endSection
              ((TestLog *)
               local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    context = local_328;
    if ((modifyType & MODIFYBITS_BUFFERDATA) != MODIFYBITS_NONE) {
      local_368._M_dataplus._M_p = (pointer)0x0;
      local_368._M_string_length = 0;
      local_368.field_2._M_allocated_capacity = 0;
      local_2e8._M_dataplus._M_p = *(pointer *)local_338;
      local_2e8._M_string_length._0_4_ = local_338->z;
      local_2e8._M_string_length._4_4_ = local_338->w;
      genRandomCoords((Random *)&local_2e8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,0,
                      local_310._8_8_);
      local_288 = (undefined1  [8])TVar25;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"BufferData, Size: ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
      std::ios_base::~ios_base(local_210);
      de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer
                ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)local_288,
                 (uchar *)local_368._M_dataplus._M_p,
                 local_368._M_string_length - (long)local_368._M_dataplus._M_p);
      TVar2 = TStack_280;
      auVar4 = local_288;
      uVar18 = local_310._M_allocated_capacity;
      local_288 = (undefined1  [8])local_310._M_allocated_capacity;
      TStack_280.order = local_310._8_4_;
      TStack_280.type = local_310._12_4_;
      TVar5 = TStack_280;
      local_310._M_allocated_capacity = (size_type)auVar4;
      TStack_280.order = TVar2.order;
      TStack_280.type = TVar2.type;
      local_310._8_4_ = TStack_280.order;
      local_310._12_4_ = TStack_280.type;
      TStack_280 = TVar5;
      de::detail::ArrayBuffer_AlignedFree((void *)uVar18);
      glu::TextureBuffer::upload((TextureBuffer *)local_320);
      if ((TextureFormat)local_368._M_dataplus._M_p != (TextureFormat)0x0) {
        operator_delete(local_368._M_dataplus._M_p,
                        local_368.field_2._M_allocated_capacity - (long)local_368._M_dataplus._M_p);
      }
    }
    if ((modifyType & MODIFYBITS_BUFFERSUBDATA) != MODIFYBITS_NONE) {
      iVar10 = (*context->_vptr_RenderContext[3])(context);
      puVar3 = local_2f8;
      uVar18 = local_310._8_8_;
      lVar23 = CONCAT44(extraout_var_02,iVar10);
      fVar27 = deRandom_getFloat(local_338);
      pvVar22 = local_300;
      if (puVar3 != (uchar *)0x0) {
        uVar18 = puVar3;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar18;
      uVar16 = (ulong)fVar27;
      uVar16 = (long)(fVar27 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
      sVar19 = 0x40;
      if (0x40 < uVar16) {
        sVar19 = uVar16;
      }
      dVar12 = deRandom_getUint32(local_338);
      sVar26 = (ulong)dVar12 % ((local_310._8_8_ - (long)pvVar22) - sVar19) + (long)pvVar22;
      local_368._M_dataplus._M_p = (pointer)0x0;
      local_368._M_string_length = 0;
      local_368.field_2._M_allocated_capacity = 0;
      local_2e8._M_dataplus._M_p = *(pointer *)local_338;
      local_2e8._M_string_length._0_4_ = local_338->z;
      local_2e8._M_string_length._4_4_ = local_338->w;
      genRandomCoords((Random *)&local_2e8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,sVar26,
                      sVar19);
      TVar25 = local_340;
      local_288._0_4_ = local_340.order;
      local_288._4_4_ = local_340.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"BufferSubData, Offset: ",0x17);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,", Size: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
      std::ios_base::~ios_base(local_210);
      (**(code **)(lVar23 + 0x40))(0x8c2a,local_2ec);
      (**(code **)(lVar23 + 0x168))
                (0x8c2a,(long)(int)sVar26,
                 (long)(int)((int)local_368._M_string_length -
                            (ChannelOrder)local_368._M_dataplus._M_p));
      (**(code **)(lVar23 + 0x40))(0x8c2a,0);
      dVar12 = (**(code **)(lVar23 + 0x800))();
      glu::checkError(dVar12,"Failed to update data with glBufferSubData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1cb);
      memcpy((char *)(sVar26 + local_310._M_allocated_capacity),local_368._M_dataplus._M_p,
             (long)(int)((int)local_368._M_string_length - (ChannelOrder)local_368._M_dataplus._M_p)
            );
      context = local_328;
      if ((TextureFormat)local_368._M_dataplus._M_p != (TextureFormat)0x0) {
        operator_delete(local_368._M_dataplus._M_p,
                        local_368.field_2._M_allocated_capacity - (long)local_368._M_dataplus._M_p);
      }
    }
    if ((modifyType & MODIFYBITS_MAPBUFFER_WRITE) != MODIFYBITS_NONE) {
      iVar10 = (*context->_vptr_RenderContext[3])(context);
      puVar3 = local_2f8;
      uVar18 = local_310._8_8_;
      lVar23 = CONCAT44(extraout_var_03,iVar10);
      fVar27 = deRandom_getFloat(local_338);
      pvVar22 = local_300;
      if (puVar3 != (uchar *)0x0) {
        uVar18 = puVar3;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar18;
      uVar16 = (ulong)fVar27;
      uVar16 = (long)(fVar27 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
      sVar19 = 0x40;
      if (0x40 < uVar16) {
        sVar19 = uVar16;
      }
      dVar12 = deRandom_getUint32(local_338);
      sVar26 = (ulong)dVar12 % ((local_310._8_8_ - (long)pvVar22) - sVar19) + (long)pvVar22;
      local_368._M_dataplus._M_p = (pointer)0x0;
      local_368._M_string_length = 0;
      local_368.field_2._M_allocated_capacity = 0;
      local_2e8._M_dataplus._M_p = *(pointer *)local_338;
      local_2e8._M_string_length._0_4_ = local_338->z;
      local_2e8._M_string_length._4_4_ = local_338->w;
      genRandomCoords((Random *)&local_2e8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,sVar26,
                      sVar19);
      TVar25 = local_340;
      local_288._0_4_ = local_340.order;
      local_288._4_4_ = local_340.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"glMapBufferRange, Write Only, Offset: ",0x26);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,", Size: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
      std::ios_base::~ios_base(local_210);
      (**(code **)(lVar23 + 0x40))(0x8c2a,local_2ec);
      context = local_328;
      lVar14 = (**(code **)(lVar23 + 0xd00))(0x8c2a,(long)(int)sVar26,(long)(int)sVar19,2);
      dVar12 = (**(code **)(lVar23 + 0x800))();
      glu::checkError(dVar12,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1e3);
      if (lVar14 == 0) {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar15,(char *)0x0,"ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x1e4);
LAB_0081ebb5:
        __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)((int)local_368._M_string_length - (ChannelOrder)local_368._M_dataplus._M_p)) {
        lVar17 = 0;
        do {
          *(uchar *)(lVar14 + lVar17) = *(uchar *)((long)local_368._M_dataplus._M_p + lVar17);
          lVar17 = lVar17 + 1;
        } while (lVar17 < (int)((int)local_368._M_string_length -
                               (ChannelOrder)local_368._M_dataplus._M_p));
      }
      cVar7 = (**(code **)(lVar23 + 0x1670))(0x8c2a);
      if (cVar7 == '\0') {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar15,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x1e9);
        goto LAB_0081ebb5;
      }
      (**(code **)(lVar23 + 0x40))(0x8c2a,0);
      dVar12 = (**(code **)(lVar23 + 0x800))();
      glu::checkError(dVar12,"Failed to update data with glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x1ec);
      memcpy((char *)(sVar26 + local_310._M_allocated_capacity),local_368._M_dataplus._M_p,
             (long)(int)((int)local_368._M_string_length - (ChannelOrder)local_368._M_dataplus._M_p)
            );
      if ((TextureFormat)local_368._M_dataplus._M_p != (TextureFormat)0x0) {
        operator_delete(local_368._M_dataplus._M_p,
                        local_368.field_2._M_allocated_capacity - (long)local_368._M_dataplus._M_p);
      }
    }
    if ((modifyType & MODIFYBITS_MAPBUFFER_READWRITE) != MODIFYBITS_NONE) {
      iVar10 = (*context->_vptr_RenderContext[3])(context);
      uVar18 = local_310._8_8_;
      fVar27 = deRandom_getFloat(local_338);
      if (local_2f8 != (uchar *)0x0) {
        uVar18 = local_2f8;
      }
      fVar27 = (fVar27 * 0.3 + 0.7) * (float)(ulong)uVar18;
      uVar16 = (ulong)fVar27;
      uVar16 = (long)(fVar27 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
      sVar19 = 0x40;
      if (0x40 < uVar16) {
        sVar19 = uVar16;
      }
      dVar12 = deRandom_getUint32(local_338);
      offset_00 = (ulong)dVar12 % ((local_310._8_8_ - (long)local_300) - sVar19) + (long)local_300;
      pcVar24 = (char *)(local_310._M_allocated_capacity + offset_00);
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.x = local_338->x;
      local_48.y = local_338->y;
      local_48.z = local_338->z;
      local_48.w = local_338->w;
      local_330 = CONCAT44(extraout_var_04,iVar10);
      genRandomCoords((Random *)&local_48,&local_2c8,offset_00,sVar19);
      local_288._0_4_ = local_340.order;
      local_288._4_4_ = local_340.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&TStack_280,"glMapBufferRange, Read Write, Offset: ",0x26);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,", Size: ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
      std::ios_base::~ios_base(local_210);
      sVar26 = local_330;
      (**(code **)(local_330 + 0x40))(0x8c2a,local_2ec);
      lVar23 = (**(code **)(sVar26 + 0xd00))(0x8c2a,(long)(int)offset_00,(long)(int)sVar19,3);
      dVar12 = (**(code **)(local_330 + 0x800))();
      glu::checkError(dVar12,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x207);
      if (lVar23 == 0) {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar15,(char *)0x0,"ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x208);
LAB_0081ec23:
        __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((int)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
          (int)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start < 1) {
        uVar16 = 0;
      }
      else {
        lVar14 = 0;
        uVar16 = 0;
        do {
          if (*(char *)(lVar23 + lVar14) != pcVar24[lVar14]) {
            if (uVar16 < 0x18) {
              local_288._0_4_ = local_340.order;
              local_288._4_4_ = local_340.type;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&TStack_280,"Invalid byte in mapped buffer. ",0x1f);
              local_b0 = (ulong)*(byte *)((long)(qpTestLog **)
                                                local_2c8.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar14);
              tcu::Format::Hex<2ul>::toString_abi_cxx11_(&local_368,&local_b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&TStack_280,local_368._M_dataplus._M_p,
                         local_368._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280," at ",4);
              std::ostream::operator<<(&TStack_280,(int)lVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&TStack_280,", expected ",0xb);
              local_b8 = (ulong)(byte)pcVar24[lVar14];
              tcu::Format::Hex<2ul>::toString_abi_cxx11_(&local_2e8,&local_b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&TStack_280,local_2e8._M_dataplus._M_p,
                         local_2e8._M_string_length);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != &local_368.field_2) {
                operator_delete(local_368._M_dataplus._M_p,
                                (ulong)(local_368.field_2._M_allocated_capacity + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
              std::ios_base::~ios_base(local_210);
            }
            uVar16 = uVar16 + 1;
          }
          *(undefined1 *)(lVar23 + lVar14) =
               *(undefined1 *)
                ((long)(qpTestLog **)
                       local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar14);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)local_2c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                          (int)local_2c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      }
      cVar7 = (**(code **)(local_330 + 0x1670))(0x8c2a);
      context = local_328;
      if (cVar7 == '\0') {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar15,(char *)0x0,"gl.unmapBuffer(GL_TEXTURE_BUFFER)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                   ,0x217);
        goto LAB_0081ec23;
      }
      if (uVar16 != 0) {
        local_288._0_4_ = local_340.order;
        local_288._4_4_ = local_340.type;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&TStack_280);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&TStack_280,"Total of ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)&TStack_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&TStack_280," invalid bytes.",0xf);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&TStack_280);
        std::ios_base::~ios_base(local_210);
        local_288 = (undefined1  [8])local_278;
        local_368._M_dataplus._M_p = (pointer)0x1d;
        local_288 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_368);
        local_278[0]._M_allocated_capacity = local_368._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_288 + 0xd),"in mappe",8);
        builtin_strncpy((char *)((long)local_288 + 0x15),"d buffer",8);
        *(undefined8 *)local_288 = 0x2064696c61766e49;
        builtin_strncpy((char *)((long)local_288 + 8),"data in ",8);
        TStack_280 = (TextureFormat)local_368._M_dataplus._M_p;
        *(uchar *)((long)local_288 + (long)local_368._M_dataplus._M_p) = '\0';
        tcu::ResultCollector::fail(&local_a8,(string *)local_288);
        if (local_288 != (undefined1  [8])local_278) {
          operator_delete((void *)local_288,(ulong)(local_278[0]._M_allocated_capacity + 1));
        }
      }
      sVar19 = local_330;
      (**(code **)(local_330 + 0x40))(0x8c2a,0);
      dVar12 = (**(code **)(sVar19 + 0x800))();
      glu::checkError(dVar12,"Failed to update data with glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                      ,0x221);
      if (0 < (int)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
              (int)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
        lVar23 = 0;
        do {
          pcVar24[lVar23] =
               *(char *)((long)(qpTestLog **)
                               local_2c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar23);
          lVar23 = lVar23 + 1;
        } while (lVar23 < (int)local_2c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                          (int)local_2c8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      }
      TVar25 = local_340;
      if ((TestLog *)
          local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (TestLog *)0x0) {
        operator_delete(local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        TVar25 = local_340;
      }
    }
    tcu::TestLog::endSection(local_100.m_log);
  }
  if (postRender != RENDERBITS_NONE) {
    local_368._M_dataplus._M_p = (pointer)0x300000008;
    pvVar22 = (void *)local_2b0.m_pixels.m_cap;
    if ((void *)local_2b0.m_pixels.m_cap != (void *)0x0) {
      pvVar22 = local_2b0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_368,local_2b0.m_width,
               local_2b0.m_height,1,pvVar22);
    render((TestLog *)TVar25,context,postRender,(Random *)local_338,postRenderProgram,
           (TextureBuffer *)local_320,(PixelBufferAccess *)local_288);
  }
  glu::TextureBuffer::~TextureBuffer((TextureBuffer *)local_320);
  local_288._0_4_ = RGBA;
  local_288._4_4_ = UNORM_INT8;
  if ((void *)local_2b0.m_pixels.m_cap != (void *)0x0) {
    local_2b0.m_pixels.m_cap = (size_t)local_2b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_320,(TextureFormat *)local_288,local_2b0.m_width,
             local_2b0.m_height,1,(void *)local_2b0.m_pixels.m_cap);
  local_288 = (undefined1  [8])local_278;
  local_368._M_dataplus._M_p = (pointer)0x16;
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_368)
  ;
  local_278[0]._M_allocated_capacity = local_368._M_dataplus._M_p;
  *(undefined8 *)local_288 = 0x7320796669726556;
  builtin_strncpy((char *)((long)local_288 + 8),"creen co",8);
  builtin_strncpy((char *)((long)local_288 + 0xe),"contents",8);
  TStack_280 = (TextureFormat)local_368._M_dataplus._M_p;
  *(char *)((long)local_288 + (long)local_368._M_dataplus._M_p) = '\0';
  local_2e8._M_dataplus._M_p = (pointer)0x16;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_2e8);
  local_368.field_2._M_allocated_capacity = (size_type)local_2e8._M_dataplus._M_p;
  builtin_strncpy(local_368._M_dataplus._M_p,"Verify screen contents",0x16);
  local_368._M_string_length = (size_type)local_2e8._M_dataplus._M_p;
  local_368._M_dataplus._M_p[(long)local_2e8._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2c8,(TestLog *)local_340,(string *)local_288,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  TVar25 = local_340;
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288,local_278[0]._M_allocated_capacity + 1);
  }
  tcu::Surface::Surface((Surface *)&local_368,(deUint32)local_318,local_318._4_4_);
  local_2e8._M_dataplus._M_p = (pointer)0x300000008;
  uVar18 = local_368.field_2._M_allocated_capacity;
  if ((void *)local_368.field_2._M_allocated_capacity != (void *)0x0) {
    uVar18 = local_368._M_string_length;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_2e8,
             (int)local_368._M_dataplus._M_p,local_368._M_dataplus._M_p._4_4_,1,(void *)uVar18);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_288);
  local_2e8._M_dataplus._M_p = (pointer)0x300000008;
  uVar18 = local_368.field_2._M_allocated_capacity;
  if ((void *)local_368.field_2._M_allocated_capacity != (void *)0x0) {
    uVar18 = local_368._M_string_length;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_288,(TextureFormat *)&local_2e8,
             (int)local_368._M_dataplus._M_p,local_368._M_dataplus._M_p._4_4_,1,(void *)uVar18);
  bVar6 = tcu::fuzzyCompare((TestLog *)TVar25,"Result of rendering","Result of rendering",
                            (ConstPixelBufferAccess *)local_320,(ConstPixelBufferAccess *)local_288,
                            0.05,COMPARE_LOG_RESULT);
  if (!bVar6) {
    local_288 = (undefined1  [8])local_278;
    local_2e8._M_dataplus._M_p = (pointer)0x10;
    local_288 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_288,(ulong)&local_2e8);
    local_278[0]._M_allocated_capacity = local_2e8._M_dataplus._M_p;
    *(undefined8 *)local_288 = 0x6e697265646e6552;
    builtin_strncpy((char *)((long)local_288 + 8),"g failed",8);
    TStack_280 = (TextureFormat)local_2e8._M_dataplus._M_p;
    *(char *)((long)local_288 + (long)local_2e8._M_dataplus._M_p) = '\0';
    tcu::ResultCollector::fail(&local_a8,(string *)local_288);
    if (local_288 != (undefined1  [8])local_278) {
      operator_delete((void *)local_288,local_278[0]._M_allocated_capacity + 1);
    }
  }
  tcu::Surface::~Surface((Surface *)&local_368);
  tcu::TestLog::endSection
            ((TestLog *)
             local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::ResultCollector::setTestContextResult(&local_a8,local_c8);
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_message._M_dataplus._M_p != &local_a8.m_message.field_2) {
    operator_delete(local_a8.m_message._M_dataplus._M_p,
                    local_a8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.m_prefix._M_dataplus._M_p != &local_a8.m_prefix.field_2) {
    operator_delete(local_a8.m_prefix._M_dataplus._M_p,
                    local_a8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void runTests (tcu::TestContext&	testCtx,
			   glu::RenderContext&	renderContext,
			   de::Random&			rng,
			   deUint32				format,
			   size_t				bufferSize,
			   size_t				offset,
			   size_t				size,
			   RenderBits			preRender,
			   glu::ShaderProgram*	preRenderProgram,
			   ModifyBits			modifyType,
			   RenderBits			postRender,
			   glu::ShaderProgram*	postRenderProgram)
{
	const tcu::RenderTarget	renderTarget	(renderContext.getRenderTarget());
	const glw::Functions&	gl				= renderContext.getFunctions();

	const int				width			= de::min<int>(renderTarget.getWidth(), MAX_VIEWPORT_WIDTH);
	const int				height			= de::min<int>(renderTarget.getHeight(), MAX_VIEWPORT_HEIGHT);
	const tcu::Vec4			clearColor		(0.25f, 0.5f, 0.75f, 1.0f);

	TestLog&				log				= testCtx.getLog();
	tcu::ResultCollector	resultCollector	(log);

	logImplementationInfo(log, renderContext);
	logTextureInfo(log, format, bufferSize, offset, size);

	{
		tcu::Surface			referenceTarget	(width, height);
		vector<deUint8>			bufferData;

		genRandomCoords(rng, bufferData, 0, bufferSize);

		for (deUint8 i = 0; i < 4; i++)
		{
			const deUint8 val = extend2BitsToByte(i);

			if (val >= offset && val < offset + size)
			{
				bufferData[val*2 + 0] = (i / 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
				bufferData[val*2 + 1] = (i % 2 == 0 ? extend2BitsToByte(0x2u) : extend2BitsToByte(0x01u));
			}
		}

		{
			glu::TextureBuffer texture (renderContext, format, bufferSize, offset, size, &(bufferData[0]));

			TCU_CHECK_MSG(width >= MIN_VIEWPORT_WIDTH || height >= MIN_VIEWPORT_HEIGHT, "Too small viewport");

			DE_ASSERT(preRender == 0 || preRenderProgram);
			DE_ASSERT(postRender == 0 || postRenderProgram);

			gl.viewport(0, 0, width, height);
			gl.clearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Screen setup failed");

			tcu::clear(referenceTarget.getAccess(), clearColor);

			texture.upload();

			if (preRender != 0)
				render(log, renderContext, preRender, rng, *preRenderProgram, texture, referenceTarget.getAccess());

			if (modifyType != 0)
				modify(log, resultCollector, renderContext, modifyType, rng, texture);

			if (postRender != 0)
				render(log, renderContext, postRender, rng, *postRenderProgram, texture, referenceTarget.getAccess());
		}

		verifyScreen(log, resultCollector, renderContext, referenceTarget.getAccess());

		resultCollector.setTestContextResult(testCtx);
	}
}